

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall testing::Matcher<const_bool_&>::Matcher(Matcher<const_bool_&> *this,bool *value)

{
  ComparisonBase<testing::internal::EqMatcher<bool>,_bool,_std::equal_to<void>_> local_31;
  Matcher<const_bool_&> local_30;
  bool *local_18;
  bool *value_local;
  Matcher<const_bool_&> *this_local;
  
  local_18 = value;
  value_local = (bool *)this;
  internal::MatcherBase<const_bool_&>::MatcherBase(&this->super_MatcherBase<const_bool_&>);
  (this->super_MatcherBase<const_bool_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_029d70d8;
  local_31.rhs_ = (bool)Eq<bool>((bool)(*local_18 & 1));
  Matcher<bool_const&>::Matcher<testing::internal::EqMatcher<bool>,void>
            ((Matcher<bool_const&> *)&local_30,(EqMatcher<bool> *)&local_31);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}